

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateGetEnumDescriptorSpecializations
          (EnumGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *file;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  EnumGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->variables_);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "template <> struct is_proto_enum< $classtype$> : ::std::true_type {};\n");
  file = EnumDescriptor::file(this->descriptor_);
  bVar1 = HasDescriptorMethods(file,this->options_);
  if (bVar1) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "template <>\ninline const EnumDescriptor* GetEnumDescriptor< $classtype$>() {\n  return $classtype$_descriptor();\n}\n"
              );
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void EnumGenerator::GenerateGetEnumDescriptorSpecializations(
    io::Printer* printer) {
  Formatter format(printer, variables_);
  format(
      "template <> struct is_proto_enum< $classtype$> : ::std::true_type "
      "{};\n");
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "template <>\n"
        "inline const EnumDescriptor* GetEnumDescriptor< $classtype$>() {\n"
        "  return $classtype$_descriptor();\n"
        "}\n");
  }
}